

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sfmDec.c
# Opt level: O1

int Sfm_DecCombineDec(Sfm_Dec_t *p,word *pTruth0,word *pTruth1,int *pSupp0,int *pSupp1,int nSupp0,
                     int nSupp1,word *pTruth,int *pSupp,int Var)

{
  size_t __n;
  int iVar1;
  bool bVar2;
  char cVar3;
  int iVar4;
  uint nVars;
  long lVar5;
  int *piVar6;
  ulong uVar7;
  uint uVar8;
  uint uVar9;
  uint uVar10;
  long lVar11;
  int *piVar12;
  word *pwVar13;
  int *piVar14;
  ulong uVar15;
  
  uVar8 = 1 << ((char)nSupp0 - 6U & 0x1f);
  if (nSupp0 < 7) {
    uVar8 = 1;
  }
  if (nSupp0 == nSupp1) {
    __n = (long)nSupp0 * 4;
    iVar4 = bcmp(pSupp0,pSupp1,__n);
    if (iVar4 == 0) {
      lVar5 = (long)(int)uVar8;
      iVar4 = bcmp(pTruth0,pTruth1,lVar5 * 8);
      if (iVar4 == 0) {
        memcpy(pSupp,pSupp0,__n);
        memcpy(pTruth,pTruth0,lVar5 * 8);
        iVar4 = p->pPars->nVarMax;
        if (iVar4 == nSupp0) {
          return nSupp0;
        }
        if (iVar4 <= nSupp0) goto LAB_004aff40;
        uVar10 = 1 << ((char)iVar4 - 6U & 0x1f);
        if (iVar4 < 7) {
          uVar10 = 1;
        }
        if (uVar8 == uVar10) {
          return nSupp0;
        }
        if ((int)uVar8 < (int)uVar10) {
          if ((int)uVar10 < 1) {
            return nSupp0;
          }
          lVar11 = 0;
          pwVar13 = pTruth;
          do {
            if (0 < (int)uVar8) {
              uVar15 = 0;
              do {
                pwVar13[uVar15] = pTruth[uVar15];
                uVar15 = uVar15 + 1;
              } while (uVar8 != uVar15);
            }
            lVar11 = lVar11 + lVar5;
            pwVar13 = pwVar13 + lVar5;
          } while (lVar11 < (long)(ulong)uVar10);
          return nSupp0;
        }
        goto LAB_004aff7e;
      }
    }
  }
  piVar6 = pSupp1;
  piVar12 = pSupp0;
  piVar14 = pSupp;
  if (0 < nSupp1 && 0 < nSupp0) {
    do {
      iVar4 = *piVar12;
      iVar1 = *piVar6;
      if (iVar4 == iVar1) {
        piVar12 = piVar12 + 1;
        *piVar14 = iVar4;
        piVar6 = piVar6 + 1;
      }
      else if (iVar4 < iVar1) {
        piVar12 = piVar12 + 1;
        *piVar14 = iVar4;
      }
      else {
        piVar6 = piVar6 + 1;
        *piVar14 = iVar1;
      }
      piVar14 = piVar14 + 1;
    } while ((piVar12 < pSupp0 + nSupp0) && (piVar6 < pSupp1 + nSupp1));
  }
  for (; piVar12 < pSupp0 + nSupp0; piVar12 = piVar12 + 1) {
    *piVar14 = *piVar12;
    piVar14 = piVar14 + 1;
  }
  for (; piVar6 < pSupp1 + nSupp1; piVar6 = piVar6 + 1) {
    *piVar14 = *piVar6;
    piVar14 = piVar14 + 1;
  }
  uVar15 = (ulong)((long)piVar14 - (long)pSupp) >> 2;
  uVar10 = (uint)uVar15;
  if (0x10 < (int)uVar10) {
    __assert_fail("vArr->nSize <= vArr->nCap",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecInt.h"
                  ,0x6ec,"void Vec_IntTwoMerge2Int(Vec_Int_t *, Vec_Int_t *, Vec_Int_t *)");
  }
  if ((int)uVar10 < nSupp0) {
    __assert_fail("vArr->nSize >= vArr1->nSize",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecInt.h"
                  ,0x6ed,"void Vec_IntTwoMerge2Int(Vec_Int_t *, Vec_Int_t *, Vec_Int_t *)");
  }
  if ((int)uVar10 < nSupp1) {
    __assert_fail("vArr->nSize >= vArr2->nSize",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecInt.h"
                  ,0x6ee,"void Vec_IntTwoMerge2Int(Vec_Int_t *, Vec_Int_t *, Vec_Int_t *)");
  }
  piVar6 = pSupp;
  if (uVar10 == 0x10) {
    if (pSupp == (int *)0x0) {
      piVar6 = (int *)malloc(0x80);
    }
    else {
      piVar6 = (int *)realloc(pSupp,0x80);
    }
    if (piVar6 == (int *)0x0) {
      __assert_fail("p->pArray",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecInt.h"
                    ,0x20c,"void Vec_IntGrow(Vec_Int_t *, int)");
    }
  }
  uVar7 = uVar15;
  if (0 < (int)uVar10) {
    uVar7 = (ulong)(uVar10 & 0x7fffffff);
    do {
      if (piVar6[uVar7 - 1] <= Var) goto LAB_004afbd9;
      piVar6[uVar7] = piVar6[uVar7 - 1];
      bVar2 = 1 < (long)uVar7;
      uVar7 = uVar7 - 1;
    } while (bVar2);
    uVar7 = 0;
  }
LAB_004afbd9:
  piVar6[(int)uVar7] = Var;
  nVars = 0xfffffffe;
  if ((int)uVar10 < p->pPars->nVarMax) {
    nVars = uVar10 + 1;
    cVar3 = (char)uVar15;
    if (nVars != nSupp0) {
      if ((int)uVar10 < nSupp0) goto LAB_004aff40;
      uVar9 = 1 << (cVar3 - 5U & 0x1f);
      if ((int)uVar10 < 6) {
        uVar9 = 1;
      }
      if (uVar8 != uVar9) {
        if ((int)uVar9 <= (int)uVar8) goto LAB_004aff7e;
        if (0 < (int)uVar9) {
          lVar5 = 0;
          pwVar13 = pTruth0;
          do {
            if (0 < (int)uVar8) {
              uVar15 = 0;
              do {
                pwVar13[uVar15] = pTruth0[uVar15];
                uVar15 = uVar15 + 1;
              } while (uVar8 != uVar15);
            }
            lVar5 = lVar5 + (int)uVar8;
            pwVar13 = pwVar13 + (int)uVar8;
          } while (lVar5 < (long)(ulong)uVar9);
        }
      }
    }
    if (nVars != nSupp1) {
      if ((int)uVar10 < nSupp1) goto LAB_004aff40;
      uVar8 = 1 << ((char)nSupp1 - 6U & 0x1f);
      if (nSupp1 < 7) {
        uVar8 = 1;
      }
      uVar9 = 1 << (cVar3 - 5U & 0x1f);
      if ((int)uVar10 < 6) {
        uVar9 = 1;
      }
      if (uVar8 != uVar9) {
        if ((int)uVar9 <= (int)uVar8) goto LAB_004aff7e;
        if (0 < (int)uVar9) {
          lVar5 = 0;
          pwVar13 = pTruth1;
          do {
            if (0 < (int)uVar8) {
              uVar15 = 0;
              do {
                pwVar13[uVar15] = pTruth1[uVar15];
                uVar15 = uVar15 + 1;
              } while (uVar8 != uVar15);
            }
            lVar5 = lVar5 + (int)uVar8;
            pwVar13 = pwVar13 + (int)uVar8;
          } while (lVar5 < (long)(ulong)uVar9);
        }
      }
    }
    Abc_TtExpand(pTruth0,nVars,pSupp0,nSupp0,pSupp,nVars);
    Abc_TtExpand(pTruth1,nVars,pSupp1,nSupp1,pSupp,nVars);
    if ((int)uVar10 < 0) {
      lVar5 = -1;
    }
    else {
      uVar15 = 0;
      do {
        if (piVar6[uVar15] == Var) goto LAB_004afd58;
        uVar15 = uVar15 + 1;
      } while (nVars != uVar15);
      uVar15 = 0xffffffffffffffff;
LAB_004afd58:
      lVar5 = (long)(int)uVar15;
    }
    uVar8 = 1 << (cVar3 - 5U & 0x1f);
    if ((int)uVar10 < 6) {
      uVar8 = 1;
    }
    if (0 < (int)uVar8) {
      pwVar13 = p->pTtElems[lVar5];
      uVar15 = 0;
      do {
        pTruth[uVar15] = (pTruth1[uVar15] ^ pTruth0[uVar15]) & pwVar13[uVar15] ^ pTruth0[uVar15];
        uVar15 = uVar15 + 1;
      } while (uVar8 != uVar15);
    }
    uVar10 = p->pPars->nVarMax;
    if (nVars != uVar10) {
      if ((int)uVar10 <= (int)nVars) {
LAB_004aff40:
        __assert_fail("nVarS < nVarB",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/util/utilTruth.h"
                      ,0x301,"void Abc_TtStretch6(word *, int, int)");
      }
      uVar9 = 1 << ((char)uVar10 - 6U & 0x1f);
      if ((int)uVar10 < 7) {
        uVar9 = 1;
      }
      if (uVar8 != uVar9) {
        if ((int)uVar9 <= (int)uVar8) {
LAB_004aff7e:
          __assert_fail("step < nWords",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/util/utilTruth.h"
                        ,0x306,"void Abc_TtStretch6(word *, int, int)");
        }
        if (0 < (int)uVar9) {
          lVar5 = 0;
          pwVar13 = pTruth;
          do {
            if (0 < (int)uVar8) {
              uVar15 = 0;
              do {
                pwVar13[uVar15] = pTruth[uVar15];
                uVar15 = uVar15 + 1;
              } while (uVar8 != uVar15);
            }
            lVar5 = lVar5 + (int)uVar8;
            pwVar13 = pwVar13 + (int)uVar8;
          } while (lVar5 < (long)(ulong)uVar9);
        }
      }
    }
  }
  return nVars;
}

Assistant:

int Sfm_DecCombineDec( Sfm_Dec_t * p, word * pTruth0, word * pTruth1, int * pSupp0, int * pSupp1, int nSupp0, int nSupp1, word * pTruth, int * pSupp, int Var )
{
    Vec_Int_t vVec0 = { 2*SFM_SUPP_MAX, nSupp0, pSupp0 };
    Vec_Int_t vVec1 = { 2*SFM_SUPP_MAX, nSupp1, pSupp1 };
    Vec_Int_t vVec  = { 2*SFM_SUPP_MAX, 0,      pSupp  };
    int nWords0 = Abc_TtWordNum(nSupp0);
    int nSupp, iSuppVar;
    // check the case of equal cofactors
    if ( nSupp0 == nSupp1 && !memcmp(pSupp0, pSupp1, sizeof(int)*nSupp0) && !memcmp(pTruth0, pTruth1, sizeof(word)*nWords0) )
    {
        memcpy( pSupp,  pSupp0,  sizeof(int)*nSupp0   );
        memcpy( pTruth, pTruth0, sizeof(word)*nWords0 );
        Abc_TtStretch6( pTruth, nSupp0, p->pPars->nVarMax );
        return nSupp0;
    }
    // merge support variables
    Vec_IntTwoMerge2Int( &vVec0, &vVec1, &vVec );
    Vec_IntPushOrder( &vVec, Var );
    nSupp = Vec_IntSize( &vVec );
    if ( nSupp > p->pPars->nVarMax )
        return -2;
    // expand truth tables
    Abc_TtStretch6( pTruth0, nSupp0, nSupp );
    Abc_TtStretch6( pTruth1, nSupp1, nSupp );
    Abc_TtExpand( pTruth0, nSupp, pSupp0, nSupp0, pSupp, nSupp );
    Abc_TtExpand( pTruth1, nSupp, pSupp1, nSupp1, pSupp, nSupp );
    // perform operation
    iSuppVar = Vec_IntFind( &vVec, Var );
    Abc_TtMux( pTruth, p->pTtElems[iSuppVar], pTruth1, pTruth0, Abc_TtWordNum(nSupp) );
    Abc_TtStretch6( pTruth, nSupp, p->pPars->nVarMax );
    return nSupp;
}